

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void * mi_os_page_align_areax(_Bool conservative,void *addr,size_t size,size_t *newsize)

{
  void *p;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  byte in_DIL;
  ptrdiff_t diff;
  void *end;
  void *start;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  undefined8 local_60;
  undefined8 local_8;
  
  if (in_RCX != (long *)0x0) {
    *in_RCX = 0;
  }
  if ((in_RDX == 0) || (in_RSI == 0)) {
    local_8 = (void *)0x0;
  }
  else {
    if ((in_DIL & 1) == 0) {
      _mi_os_page_size();
      local_8 = mi_align_down_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      p = (void *)(in_RSI + in_RDX);
      _mi_os_page_size();
      local_60 = mi_align_up_ptr(p,in_stack_ffffffffffffff88);
    }
    else {
      _mi_os_page_size();
      local_8 = mi_align_up_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      _mi_os_page_size();
      local_60 = mi_align_down_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if ((long)local_60 - (long)local_8 < 1) {
      local_8 = (void *)0x0;
    }
    else if (in_RCX != (long *)0x0) {
      *in_RCX = (long)local_60 - (long)local_8;
    }
  }
  return local_8;
}

Assistant:

static void* mi_os_page_align_areax(bool conservative, void* addr, size_t size, size_t* newsize) {
  mi_assert(addr != NULL && size > 0);
  if (newsize != NULL) *newsize = 0;
  if (size == 0 || addr == NULL) return NULL;

  // page align conservatively within the range
  void* start = (conservative ? mi_align_up_ptr(addr, _mi_os_page_size())
    : mi_align_down_ptr(addr, _mi_os_page_size()));
  void* end = (conservative ? mi_align_down_ptr((uint8_t*)addr + size, _mi_os_page_size())
    : mi_align_up_ptr((uint8_t*)addr + size, _mi_os_page_size()));
  ptrdiff_t diff = (uint8_t*)end - (uint8_t*)start;
  if (diff <= 0) return NULL;

  mi_assert_internal((conservative && (size_t)diff <= size) || (!conservative && (size_t)diff >= size));
  if (newsize != NULL) *newsize = (size_t)diff;
  return start;
}